

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esni.c
# Opt level: O1

int main(int argc,char **argv)

{
  size_t *psVar1;
  char *__s2;
  int iVar2;
  int extraout_EAX;
  uint uVar3;
  int iVar4;
  FILE *fp;
  EVP_PKEY *pkey;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  ec_key_st *key;
  EC_GROUP *group;
  long lVar8;
  ptls_cipher_suite_t *ppVar9;
  ptls_buffer_t *ppVar10;
  char *pcVar11;
  ptls_buffer_t *buf_00;
  ptls_buffer_t *ppVar12;
  ptls_key_exchange_context_t **pppVar13;
  ptls_key_exchange_algorithm_t *algo;
  ushort uVar14;
  uint64_t _v;
  size_t sVar15;
  ptls_cipher_suite_t **pppVar16;
  size_t sVar17;
  uint16_t padded_length;
  ptls_buffer_t buf;
  uint64_t lifetime;
  anon_struct_2056_2_5014a043 key_exchanges;
  ptls_key_exchange_context_t *ctx [256];
  st_x9_62_keyex_context_t *psStack_1900;
  ptls_buffer_t *ppStack_18f8;
  char *pcStack_18f0;
  ptls_buffer_t *ppStack_18e8;
  code *pcStack_18e0;
  ptls_buffer_t *local_18d8;
  ushort local_18ca;
  ptls_cipher_suite_t **local_18c8;
  undefined1 local_18bc [4];
  undefined1 local_18b8 [40];
  char *local_1890;
  ptls_buffer_t *local_1888;
  undefined1 local_1880 [4];
  undefined1 local_187c [12];
  EVP_PKEY_ASN1_METHOD *local_1870;
  int local_1868 [8];
  ptls_cipher_suite_t *local_1848 [256];
  ptls_buffer_t *local_1048;
  ptls_key_exchange_context_t *local_1040 [256];
  long local_840;
  ptls_buffer_t local_838 [64];
  
  ppVar10 = (ptls_buffer_t *)(ulong)(uint)argc;
  pcStack_18e0 = (code *)0x105bae;
  OPENSSL_init_crypto(2);
  pcStack_18e0 = (code *)0x105bba;
  OPENSSL_init_crypto(0xc);
  pcStack_18e0 = (code *)0x105bbf;
  ENGINE_load_builtin_engines();
  pcStack_18e0 = (code *)0x105bc4;
  ENGINE_register_all_ciphers();
  pcStack_18e0 = (code *)0x105bc9;
  ENGINE_register_all_digests();
  pcStack_18e0 = (code *)0x105bdd;
  memset(local_1040,0,0x808);
  pcStack_18e0 = (code *)0x105bf1;
  memset(local_1848,0,0x808);
  local_18ca = 0x104;
  local_1888 = (ptls_buffer_t *)0x76a700;
  local_18d8 = local_1048;
  local_18c8 = ptls_openssl_cipher_suites + 1;
LAB_00105c34:
  do {
    while( true ) {
      pcVar5 = "K:c:d:p:h";
      pcStack_18e0 = (code *)0x105c41;
      pcVar11 = (char *)argv;
      buf_00 = ppVar10;
      iVar2 = getopt(argc,argv,"K:c:d:p:h");
      uVar14 = local_18ca;
      __s2 = _optarg;
      ppVar9 = ptls_openssl_cipher_suites[0];
      if (iVar2 < 100) break;
      if (iVar2 == 100) {
        pcStack_18e0 = (code *)0x105d25;
        iVar2 = __isoc99_sscanf(_optarg,"%lu",&local_1888);
        if ((iVar2 != 1) || (local_1888 == (ptls_buffer_t *)0x0)) goto LAB_001062fd;
        local_1888 = (ptls_buffer_t *)((long)local_1888 * 0x15180);
      }
      else {
        if (iVar2 != 0x70) {
          if (iVar2 == 0x68) {
            local_1048 = local_18d8;
            pcStack_18e0 = (code *)0x1062b2;
            printf("picotls-esni - generates an ESNI Resource Record\n\nUsage: %s [options]\nOptions:\n  -K <key-file>       private key files (repeat the option to include multiple\n                      keys)\n  -c <cipher-suite>   aes128-gcm, chacha20-poly1305, ...\n  -d <days>           number of days until expiration (default: 90)\n  -p <padded-length>  padded length (default: 260)\n  -h                  prints this help\n\n-c and -x can be used multiple times.\n\n"
                   ,*argv);
            pcStack_18e0 = (code *)0x1062b9;
            exit(0);
          }
          goto LAB_0010630e;
        }
        pcStack_18e0 = (code *)0x105c6f;
        iVar2 = __isoc99_sscanf(_optarg,"%hu",&local_18ca);
        if ((iVar2 != 1) || (local_18ca == 0)) {
          pcStack_18e0 = (code *)0x1062ca;
          main_cold_1();
LAB_001062ca:
          pcStack_18e0 = (code *)0x1062db;
          main_cold_4();
LAB_001062db:
          pcStack_18e0 = (code *)0x1062ec;
          main_cold_6();
LAB_001062ec:
          pcStack_18e0 = (code *)0x1062fd;
          main_cold_5();
LAB_001062fd:
          pcStack_18e0 = (code *)0x10630e;
          main_cold_2();
LAB_0010630e:
          local_1048 = local_18d8;
          pcStack_18e0 = (code *)0x10632b;
          printf("picotls-esni - generates an ESNI Resource Record\n\nUsage: %s [options]\nOptions:\n  -K <key-file>       private key files (repeat the option to include multiple\n                      keys)\n  -c <cipher-suite>   aes128-gcm, chacha20-poly1305, ...\n  -d <days>           number of days until expiration (default: 90)\n  -p <padded-length>  padded length (default: 260)\n  -h                  prints this help\n\n-c and -x can be used multiple times.\n\n"
                 ,*argv);
          pcStack_18e0 = (code *)0x106335;
          exit(1);
        }
      }
    }
    if (iVar2 != 0x4b) {
      if (iVar2 == -1) {
        local_1048 = local_18d8;
        if (local_18d8 == (ptls_buffer_t *)0x0) {
          local_1048 = (ptls_buffer_t *)0x1;
          local_1848[0] = &ptls_openssl_aes128gcmsha256;
        }
        if (local_840 != 0) {
          pcStack_18e0 = (code *)0x105e38;
          pcVar5 = (char *)time((time_t *)0x0);
          ppVar12 = local_1888;
          argv = (char **)local_838;
          pcStack_18e0 = (code *)0x105e57;
          memset(argv,0,0x800);
          local_18b8._0_8_ = "";
          local_18b8._8_8_ = 0;
          local_18b8._16_8_ = 0;
          local_18b8._24_8_ = (ulong)(uint)local_18b8._28_4_ << 0x20;
          pcVar11 = local_1880 + 2;
          local_1880._2_2_ = 0x1ff;
          pcStack_18e0 = (code *)0x105e88;
          uVar3 = ptls_buffer__do_pushv((ptls_buffer_t *)local_18b8,pcVar11,2);
          if (uVar3 != 0) goto LAB_00105eaa;
          pcVar11 = local_187c;
          local_187c._0_4_ = 0;
          pcStack_18e0 = (code *)0x105ea6;
          uVar3 = ptls_buffer__do_pushv((ptls_buffer_t *)local_18b8,pcVar11,4);
          if (uVar3 != 0) goto LAB_00105eaa;
          pcVar11 = "";
          buf_00 = (ptls_buffer_t *)local_18b8;
          pcStack_18e0 = (code *)0x105f23;
          uVar3 = ptls_buffer__do_pushv(buf_00,"",2);
          sVar15 = local_18b8._16_8_;
          uVar6 = (ulong)uVar3;
          if (uVar3 != 0) {
            ppVar10 = (ptls_buffer_t *)(ulong)uVar3;
            iVar2 = 6;
            goto LAB_00106076;
          }
          local_18c8 = (ptls_cipher_suite_t **)CONCAT62(local_18c8._2_6_,uVar14);
          local_18d8 = ppVar12;
          if (local_1040[0] != (ptls_key_exchange_context_t *)0x0) {
            lVar7 = 0;
            local_1890 = pcVar5;
            break;
          }
          iVar2 = 0;
          ppVar10 = (ptls_buffer_t *)0x0;
          uVar6 = 0;
          goto LAB_0010603a;
        }
      }
      else {
        if (iVar2 != 99) goto LAB_0010630e;
        pcVar5 = (char *)CONCAT71(0x11a0,ptls_openssl_cipher_suites[0] == (ptls_cipher_suite_t *)0x0
                                 );
        if (ptls_openssl_cipher_suites[0] != (ptls_cipher_suite_t *)0x0) {
          pcStack_18e0 = (code *)0x105d90;
          iVar2 = strcasecmp(ptls_openssl_cipher_suites[0]->aead->name,_optarg);
          pppVar16 = local_18c8;
          while (iVar2 != 0) {
            ppVar9 = *pppVar16;
            pcVar5 = (char *)CONCAT71((int7)((ulong)pcVar5 >> 8),
                                      ppVar9 == (ptls_cipher_suite_t *)0x0);
            if (ppVar9 == (ptls_cipher_suite_t *)0x0) goto LAB_00106335;
            pcStack_18e0 = (code *)0x105db9;
            iVar2 = strcasecmp(ppVar9->aead->name,__s2);
            pppVar16 = pppVar16 + 1;
          }
          if ((char)pcVar5 == '\0') {
            local_1848[(long)local_18d8] = ppVar9;
            local_18d8 = (ptls_buffer_t *)((long)&local_18d8->base + 1);
            goto LAB_00105c34;
          }
        }
LAB_00106335:
        pcVar11 = (char *)&local_1048;
        pcStack_18e0 = (code *)0x106346;
        buf_00 = local_18d8;
        main_cold_3();
      }
      pcStack_18e0 = (code *)0x10634b;
      main_cold_8();
      goto LAB_0010634b;
    }
    pcStack_18e0 = (code *)0x105ca1;
    fp = fopen(_optarg,"rt");
    if (fp == (FILE *)0x0) goto LAB_001062db;
    pcStack_18e0 = (code *)0x105cbb;
    pkey = PEM_read_PrivateKey(fp,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
    if (pkey == (EVP_PKEY *)0x0) goto LAB_001062ec;
    pcStack_18e0 = (code *)0x105ccf;
    fclose(fp);
    pppVar13 = local_1040 + local_840;
    pcStack_18e0 = (code *)0x105cf6;
    local_840 = local_840 + 1;
    iVar2 = ptls_openssl_create_key_exchange(pppVar13,(EVP_PKEY *)pkey);
    if (iVar2 != 0) goto LAB_001062ca;
    pcStack_18e0 = (code *)0x105d06;
    EVP_PKEY_free(pkey);
  } while( true );
  while( true ) {
    pcVar11 = "";
    pcStack_18e0 = (code *)0x105f9e;
    ppVar10 = ppVar12;
    uVar3 = ptls_buffer__do_pushv(ppVar12,"",2);
    sVar17 = local_18b8._16_8_;
    iVar2 = 6;
    if (uVar3 == 0) {
      pcVar11 = (char *)(local_1040[lVar7]->pubkey).base;
      pcStack_18e0 = (code *)0x105fcb;
      uVar3 = ptls_buffer__do_pushv(ppVar12,pcVar11,(local_1040[lVar7]->pubkey).len);
      if (uVar3 == 0) {
        uVar6 = local_18b8._16_8_ - sVar17;
        lVar8 = 8;
        do {
          *(char *)(local_18b8._0_8_ + (sVar17 - 2)) = (char)(uVar6 >> ((byte)lVar8 & 0x3f));
          lVar8 = lVar8 + -8;
          sVar17 = sVar17 + 1;
        } while (lVar8 != -8);
        iVar2 = 0;
        uVar6 = 1;
        pcVar11 = (char *)local_18b8._0_8_;
      }
      else {
        uVar6 = 0;
      }
    }
    else {
      uVar6 = 0;
      ppVar12 = ppVar10;
    }
    ppVar10 = (ptls_buffer_t *)(ulong)uVar3;
    buf_00 = ppVar12;
    pcVar5 = local_1890;
    if ((char)uVar6 == '\0') goto LAB_0010603a;
    local_1040[0] = local_1040[lVar7 + 1];
    lVar7 = lVar7 + 1;
    if (local_1040[0] == (ptls_key_exchange_context_t *)0x0) break;
    ppVar12 = (ptls_buffer_t *)local_18b8;
    uVar14 = local_1040[0]->algo->id;
    local_18bc._2_2_ = uVar14 << 8 | uVar14 >> 8;
    pcVar11 = local_18bc + 2;
    pcStack_18e0 = (code *)0x105f82;
    buf_00 = ppVar12;
    uVar3 = ptls_buffer__do_pushv(ppVar12,pcVar11,2);
    uVar6 = (ulong)uVar3;
    if (uVar3 != 0) {
      ppVar10 = (ptls_buffer_t *)(ulong)uVar3;
      iVar2 = 6;
      pcVar5 = local_1890;
      goto LAB_0010603a;
    }
  }
  iVar2 = 0;
  uVar6 = 0;
LAB_0010603a:
  if (iVar2 == 0) {
    uVar6 = local_18b8._16_8_ - sVar15;
    lVar7 = 8;
    do {
      *(char *)(local_18b8._0_8_ + (sVar15 - 2)) = (char)(uVar6 >> ((byte)lVar7 & 0x3f));
      lVar7 = lVar7 + -8;
      sVar15 = sVar15 + 1;
    } while (lVar7 != -8);
    iVar2 = 0;
    pcVar11 = (char *)local_18b8._0_8_;
  }
  ppVar12 = local_18d8;
  uVar14 = (ushort)local_18c8;
LAB_00106076:
  if (iVar2 == 6) {
LAB_00105eb4:
    while (local_838[0].base != (uint8_t *)0x0) {
      pcVar11 = (char *)0x1;
      pcStack_18e0 = (code *)0x105ecb;
      (**(code **)(local_838[0].base + 0x18))(argv,1,0,0,0);
      psVar1 = &((ptls_buffer_t *)argv)->capacity;
      argv = (char **)&((ptls_buffer_t *)argv)->capacity;
      local_838[0].base = (uint8_t *)*psVar1;
    }
    argv = (char **)local_18b8;
    pcStack_18e0 = (code *)0x105ee2;
    buf_00 = (ptls_buffer_t *)argv;
    ptls_buffer__release_memory((ptls_buffer_t *)argv);
    local_18b8._16_8_ = 0;
    local_18b8._24_8_ = 0;
    local_18b8._0_8_ = (EVP_PKEY *)0x0;
    local_18b8._8_8_ = 0;
    uVar6 = (ulong)((int)ppVar10 == 0);
  }
  else if (iVar2 == 0) {
    pcVar11 = "";
    buf_00 = (ptls_buffer_t *)local_18b8;
    pcStack_18e0 = (code *)0x10609f;
    uVar3 = ptls_buffer__do_pushv(buf_00,"",2);
    sVar15 = local_18b8._16_8_;
    uVar6 = (ulong)uVar3;
    if (uVar3 == 0) {
      iVar2 = 0;
      local_1890 = pcVar5;
      if (local_1848[0] == (ptls_cipher_suite_t *)0x0) {
        uVar6 = 1;
        ppVar10 = (ptls_buffer_t *)0x0;
      }
      else {
        local_18c8 = (ptls_cipher_suite_t **)CONCAT62(local_18c8._2_6_,uVar14);
        pppVar16 = local_1848;
        ppVar9 = local_1848[0];
        local_18d8 = ppVar12;
        do {
          pppVar16 = (ptls_cipher_suite_t **)((long)pppVar16 + 8);
          local_18bc._0_2_ = ppVar9->id << 8 | ppVar9->id >> 8;
          buf_00 = (ptls_buffer_t *)local_18b8;
          pcStack_18e0 = (code *)0x1060ff;
          pcVar11 = (char *)local_18bc;
          uVar3 = ptls_buffer__do_pushv(buf_00,(EVP_PKEY *)local_18bc,2);
          ppVar10 = (ptls_buffer_t *)(ulong)uVar3;
          uVar6 = (ulong)(uVar3 == 0);
          if (uVar3 != 0) {
            iVar2 = 6;
            break;
          }
          ppVar9 = *pppVar16;
        } while (ppVar9 != (ptls_cipher_suite_t *)0x0);
        ppVar12 = local_18d8;
        uVar14 = (ushort)local_18c8;
      }
      pcVar5 = local_1890;
      if ((char)uVar6 != '\0') {
        uVar6 = local_18b8._16_8_ - sVar15;
        lVar7 = 8;
        do {
          *(char *)(local_18b8._0_8_ + (sVar15 - 2)) = (char)(uVar6 >> ((byte)lVar7 & 0x3f));
          lVar7 = lVar7 + -8;
          sVar15 = sVar15 + 1;
        } while (lVar7 != -8);
        iVar2 = 0;
        pcVar11 = (char *)local_18b8._0_8_;
      }
    }
    else {
      ppVar10 = (ptls_buffer_t *)(ulong)uVar3;
      iVar2 = 6;
    }
    if (iVar2 != 6) {
      if (iVar2 != 0) goto LAB_00105ef1;
      local_1880._0_2_ = uVar14 << 8 | uVar14 >> 8;
      pcVar11 = local_1880;
      pcStack_18e0 = (code *)0x106193;
      uVar3 = ptls_buffer__do_pushv((ptls_buffer_t *)local_18b8,pcVar11,2);
      if (uVar3 == 0) {
        local_1870 = (EVP_PKEY_ASN1_METHOD *)
                     ((ulong)pcVar5 >> 0x38 | ((ulong)pcVar5 & 0xff000000000000) >> 0x28 |
                      ((ulong)pcVar5 & 0xff0000000000) >> 0x18 | ((ulong)pcVar5 & 0xff00000000) >> 8
                      | ((ulong)pcVar5 & 0xff000000) << 8 | ((ulong)pcVar5 & 0xff0000) << 0x18 |
                      ((ulong)pcVar5 & 0xff00) << 0x28 | (long)pcVar5 << 0x38);
        pcVar11 = (char *)&local_1870;
        pcStack_18e0 = (code *)0x1061b8;
        uVar3 = ptls_buffer__do_pushv((ptls_buffer_t *)local_18b8,pcVar11,8);
        if (uVar3 == 0) {
          pcVar11 = pcVar5 + (long)ppVar12 + -1;
          local_187c._4_8_ =
               (ulong)pcVar11 >> 0x38 | ((ulong)pcVar11 & 0xff000000000000) >> 0x28 |
               ((ulong)pcVar11 & 0xff0000000000) >> 0x18 | ((ulong)pcVar11 & 0xff00000000) >> 8 |
               ((ulong)pcVar11 & 0xff000000) << 8 | ((ulong)pcVar11 & 0xff0000) << 0x18 |
               ((ulong)pcVar11 & 0xff00) << 0x28 | (long)pcVar11 << 0x38;
          pcVar11 = local_187c + 4;
          pcStack_18e0 = (code *)0x1061e1;
          uVar3 = ptls_buffer__do_pushv((ptls_buffer_t *)local_18b8,pcVar11,8);
          if (uVar3 == 0) {
            pcVar11 = "";
            buf_00 = (ptls_buffer_t *)local_18b8;
            pcStack_18e0 = (code *)0x1061ff;
            uVar3 = ptls_buffer__do_pushv(buf_00,"",2);
            uVar6 = (ulong)uVar3;
            ppVar10 = (ptls_buffer_t *)(ulong)uVar3;
            iVar2 = 6;
            if (uVar3 == 0) {
              lVar7 = -2;
              do {
                *(char *)((long)(int *)local_18b8._0_8_ + lVar7 + local_18b8._16_8_) = '\0';
                lVar7 = lVar7 + 1;
              } while (lVar7 != 0);
              iVar2 = 0;
              uVar6 = 0;
            }
            if (iVar2 != 6) {
              if (iVar2 != 0) goto LAB_00105ef1;
              pcStack_18e0 = (code *)0x106258;
              ptls_calc_hash(&ptls_openssl_sha256,local_1868,(void *)local_18b8._0_8_,
                             local_18b8._16_8_);
              *(int *)((long)(int *)local_18b8._0_8_ + 2) = local_1868[0];
              pcVar5 = &stdout;
              pcVar11 = (char *)0x1;
              pcStack_18e0 = (code *)0x106281;
              fwrite((void *)local_18b8._0_8_,1,local_18b8._16_8_,_stdout);
              pcStack_18e0 = (code *)0x106289;
              fflush(_stdout);
              ppVar10 = (ptls_buffer_t *)0x0;
            }
            goto LAB_00105eb4;
          }
        }
      }
LAB_00105eaa:
      ppVar10 = (ptls_buffer_t *)(ulong)uVar3;
    }
    goto LAB_00105eb4;
  }
LAB_00105ef1:
  if ((uVar6 & 1) != 0) {
    return 0;
  }
LAB_0010634b:
  pcStack_18e0 = ptls_openssl_random_bytes;
  main_cold_7();
  ppStack_18e8 = (ptls_buffer_t *)0x106356;
  pcStack_18e0._0_4_ = extraout_EAX;
  uVar3 = RAND_bytes((uchar *)buf_00,(int)pcVar11);
  if (uVar3 == 1) {
    return (int)pcStack_18e0;
  }
  pppVar13 = (ptls_key_exchange_context_t **)(ulong)uVar3;
  ppStack_18e8 = (ptls_buffer_t *)ptls_openssl_create_key_exchange;
  ptls_openssl_random_bytes_cold_1();
  ppStack_18f8 = (ptls_buffer_t *)argv;
  pcStack_18f0 = pcVar5;
  ppStack_18e8 = ppVar10;
  iVar2 = EVP_PKEY_get_id(pcVar11);
  if (iVar2 == 0x40a) {
    iVar2 = evp_keyex_init(&ptls_openssl_x25519,pppVar13,(EVP_PKEY *)pcVar11);
    if (iVar2 != 0) {
      return iVar2;
    }
    EVP_PKEY_up_ref(pcVar11);
  }
  else {
    iVar4 = 0x204;
    if (iVar2 != 0x198) {
      return 0x204;
    }
    key = EVP_PKEY_get1_EC_KEY((EVP_PKEY *)pcVar11);
    group = EC_KEY_get0_group(key);
    iVar2 = EC_GROUP_get_curve_name(group);
    if (iVar2 == 0x19f) {
      algo = &ptls_openssl_secp256r1;
    }
    else if (iVar2 == 0x2cc) {
      algo = &ptls_openssl_secp521r1;
    }
    else {
      if (iVar2 != 0x2cb) goto LAB_00106445;
      algo = &ptls_openssl_secp384r1;
    }
    psStack_1900 = (st_x9_62_keyex_context_t *)0x0;
    iVar4 = x9_62_create_context(algo,&psStack_1900);
    if (iVar4 == 0) {
      psStack_1900->privkey = (EC_KEY *)key;
      iVar4 = x9_62_setup_pubkey(psStack_1900);
    }
    if (iVar4 == 0) {
      *pppVar13 = &psStack_1900->super;
    }
    else {
      if (psStack_1900 != (st_x9_62_keyex_context_t *)0x0) {
        x9_62_free_context(psStack_1900);
      }
      *pppVar13 = (ptls_key_exchange_context_t *)0x0;
      if (iVar4 != 0) {
LAB_00106445:
        EC_KEY_free(key);
        return iVar4;
      }
    }
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    ERR_load_crypto_strings();
    OpenSSL_add_all_algorithms();
#if !defined(OPENSSL_NO_ENGINE)
    /* Load all compiled-in ENGINEs */
    ENGINE_load_builtin_engines();
    ENGINE_register_all_ciphers();
    ENGINE_register_all_digests();
#endif

    struct {
        ptls_key_exchange_context_t *elements[256];
        size_t count;
    } key_exchanges = {{NULL}, 0};
    struct {
        ptls_cipher_suite_t *elements[256];
        size_t count;
    } cipher_suites = {{NULL}, 0};
    uint16_t padded_length = 260;
    uint64_t lifetime = 90 * 86400;

    int ch;
    while ((ch = getopt(argc, argv, "K:c:d:p:h")) != -1) {
        switch (ch) {
        case 'K': {
            FILE *fp;
            EVP_PKEY *pkey;
            if ((fp = fopen(optarg, "rt")) == NULL) {
                fprintf(stderr, "failed to open file:%s:%s\n", optarg, strerror(errno));
                exit(1);
            }
            if ((pkey = PEM_read_PrivateKey(fp, NULL, NULL, NULL)) == NULL) {
                fprintf(stderr, "failed to read private key from file:%s:%s\n", optarg, strerror(errno));
                exit(1);
            }
            fclose(fp);
            if (ptls_openssl_create_key_exchange(key_exchanges.elements + key_exchanges.count++, pkey) != 0) {
                fprintf(stderr, "unknown type of private key found in file:%s\n", optarg);
                exit(1);
            }
            EVP_PKEY_free(pkey);
        } break;
        case 'c': {
            size_t i;
            for (i = 0; ptls_openssl_cipher_suites[i] != NULL; ++i)
                if (strcasecmp(ptls_openssl_cipher_suites[i]->aead->name, optarg) == 0)
                    break;
            if (ptls_openssl_cipher_suites[i] == NULL) {
                fprintf(stderr, "unknown cipher-suite: %s\n", optarg);
                exit(1);
            }
            cipher_suites.elements[cipher_suites.count++] = ptls_openssl_cipher_suites[i];
        } break;
        case 'd':
            if (sscanf(optarg, "%" SCNu64, &lifetime) != 1 || lifetime == 0) {
                fprintf(stderr, "lifetime must be a positive integer\n");
                exit(1);
            }
            lifetime *= 86400; /* convert to seconds */
            break;
        case 'p':
            if (sscanf(optarg, "%" SCNu16, &padded_length) != 1 || padded_length == 0) {
                fprintf(stderr, "padded length must be a positive integer\n");
                exit(1);
            }
            break;
        case 'h':
            usage(argv[0], 0);
            break;
        default:
            usage(argv[0], 1);
            break;
        }
    }
    if (cipher_suites.count == 0)
        cipher_suites.elements[cipher_suites.count++] = &ptls_openssl_aes128gcmsha256;
    if (key_exchanges.count == 0) {
        fprintf(stderr, "no private key specified\n");
        exit(1);
    }

    argc -= optind;
    argv += optind;

    if (emit_esni(key_exchanges.elements, cipher_suites.elements, padded_length, time(NULL), lifetime) != 0) {
        fprintf(stderr, "failed to generate ESNI private structure.\n");
        exit(1);
    }

    return 0;
}